

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SwapInlinedStringDonated
          (Reflection *this,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  LogMessageFatal local_100 [23];
  Voidify local_e9;
  uint local_e8;
  uint local_e4;
  string *local_e0;
  string *absl_log_internal_check_op_result_2;
  undefined1 auStack_d0 [4];
  uint32_t index;
  undefined8 local_c8;
  LogMessageFatal local_c0 [23];
  Voidify local_a9;
  uint local_a8;
  uint local_a4;
  string *local_a0;
  string *absl_log_internal_check_op_result_1;
  undefined1 local_88 [16];
  LogMessageFatal local_78 [23];
  Voidify local_61;
  uint local_60;
  uint local_5c;
  string *local_58;
  string *absl_log_internal_check_op_result;
  uint32_t *rhs_array;
  uint32_t *lhs_array;
  bool rhs_donated;
  Arena *pAStack_38;
  bool lhs_donated;
  Arena *rhs_arena;
  Arena *lhs_arena;
  FieldDescriptor *field_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *this_local;
  
  lhs_arena = (Arena *)field;
  field_local = (FieldDescriptor *)rhs;
  rhs_local = lhs;
  lhs_local = (Message *)this;
  rhs_arena = MessageLite::GetArena(&lhs->super_MessageLite);
  pAStack_38 = MessageLite::GetArena((MessageLite *)field_local);
  if (rhs_arena == pAStack_38) {
    lhs_array._7_1_ = IsInlinedStringDonated(this,rhs_local,(FieldDescriptor *)lhs_arena);
    lhs_array._6_1_ =
         IsInlinedStringDonated(this,(Message *)field_local,(FieldDescriptor *)lhs_arena);
    if ((lhs_array._7_1_ & 1) != lhs_array._6_1_) {
      rhs_array = MutableInlinedStringDonatedArray(this,rhs_local);
      absl_log_internal_check_op_result =
           (string *)MutableInlinedStringDonatedArray(this,(Message *)field_local);
      local_5c = absl::lts_20240722::log_internal::GetReferenceableValue(*rhs_array & 1);
      local_60 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
      local_58 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                           (&local_5c,&local_60,"lhs_array[0] & 0x1u == 0u");
      if (local_58 != (string *)0x0) {
        local_88 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                   ,0xb7a,local_88._0_8_,local_88._8_8_);
        pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_78);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_61,pLVar1);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
      }
      local_a4 = absl::lts_20240722::log_internal::GetReferenceableValue
                           (*(uint *)absl_log_internal_check_op_result & 1);
      local_a8 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
      local_a0 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                           (&local_a4,&local_a8,"rhs_array[0] & 0x1u == 0u");
      if (local_a0 != (string *)0x0) {
        _auStack_d0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a0);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                   ,0xb7b,auStack_d0._0_8_,auStack_d0._8_8_);
        pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_c0);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_a9,pLVar1);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_c0);
      }
      absl_log_internal_check_op_result_2._4_4_ =
           internal::ReflectionSchema::InlinedStringIndex
                     (&this->schema_,(FieldDescriptor *)lhs_arena);
      local_e4 = absl::lts_20240722::log_internal::GetReferenceableValue
                           (absl_log_internal_check_op_result_2._4_4_);
      local_e8 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
      local_e0 = absl::lts_20240722::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                           (&local_e4,&local_e8,"index > 0u");
      if (local_e0 != (string *)0x0) {
        auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_e0);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_100,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                   ,0xb7e,auVar2._0_8_,auVar2._8_8_);
        pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_100);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_e9,pLVar1);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_100);
      }
      if ((lhs_array._6_1_ & 1) == 0) {
        ClearInlinedStringDonated(absl_log_internal_check_op_result_2._4_4_,rhs_array);
        SetInlinedStringDonated
                  (absl_log_internal_check_op_result_2._4_4_,
                   (uint32_t *)absl_log_internal_check_op_result);
      }
      else {
        SetInlinedStringDonated(absl_log_internal_check_op_result_2._4_4_,rhs_array);
        ClearInlinedStringDonated
                  (absl_log_internal_check_op_result_2._4_4_,
                   (uint32_t *)absl_log_internal_check_op_result);
      }
    }
  }
  return;
}

Assistant:

void Reflection::SwapInlinedStringDonated(Message* lhs, Message* rhs,
                                          const FieldDescriptor* field) const {
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  // If arenas differ, inined string fields are swapped by copying values.
  // Donation status should not be swapped.
  if (lhs_arena != rhs_arena) {
    return;
  }
  bool lhs_donated = IsInlinedStringDonated(*lhs, field);
  bool rhs_donated = IsInlinedStringDonated(*rhs, field);
  if (lhs_donated == rhs_donated) {
    return;
  }
  // If one is undonated, both must have already registered ArenaDtor.
  uint32_t* lhs_array = MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = MutableInlinedStringDonatedArray(rhs);
  ABSL_CHECK_EQ(lhs_array[0] & 0x1u, 0u);
  ABSL_CHECK_EQ(rhs_array[0] & 0x1u, 0u);
  // Swap donation status bit.
  uint32_t index = schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  if (rhs_donated) {
    SetInlinedStringDonated(index, lhs_array);
    ClearInlinedStringDonated(index, rhs_array);
  } else {  // lhs_donated
    ClearInlinedStringDonated(index, lhs_array);
    SetInlinedStringDonated(index, rhs_array);
  }
}